

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,UniformBlockMemberAlignNonPowerOf2Test *this,
          GLuint test_case_index)

{
  pointer ptVar1;
  GLchar *__s;
  size_t sVar2;
  stringstream stream;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Type: ",6);
  __s = Utils::Type::GetGLSLTypeName(&ptVar1[test_case_index].m_type);
  if (__s == (GLchar *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", align: ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string UniformBlockMemberAlignNonPowerOf2Test::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Type: " << test_case.m_type.GetGLSLTypeName() << ", align: " << test_case.m_alignment;

	return stream.str();
}